

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_base64.cpp
# Opt level: O0

void __thiscall ON_DecodeBase64::Begin(ON_DecodeBase64 *this)

{
  ON_DecodeBase64 *this_local;
  
  this->m_decode_count = 0;
  this->m_output_count = 0;
  memset(this->m_output,0,0x200);
  this->m_status = 0;
  this->m_cache_count = 0;
  this->m_cache[0] = 0;
  this->m_cache[1] = 0;
  this->m_cache[2] = 0;
  this->m_cache[3] = 0;
  return;
}

Assistant:

void ON_DecodeBase64::Begin()
{
  m_decode_count = 0;
  m_output_count = 0;
  memset(m_output,0,512);
  m_status = 0;
  m_cache_count = 0;
  m_cache[0] = 0;
  m_cache[1] = 0;
  m_cache[2] = 0;
  m_cache[3] = 0;  
}